

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::parseInputMask(QWidgetLineControl *this,QString *maskFields)

{
  bool bVar1;
  bool bVar2;
  char16_t cVar3;
  qsizetype qVar4;
  QString *txt;
  long lVar5;
  type pMVar6;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int index;
  bool escape;
  bool s;
  Casemode m;
  int i;
  bool escaped;
  qsizetype delimiter;
  QChar c_1;
  QChar c;
  undefined4 in_stack_ffffffffffffff08;
  CaseSensitivity in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Casemode in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff22;
  bool bVar7;
  undefined1 in_stack_ffffffffffffff23;
  byte bVar8;
  undefined4 in_stack_ffffffffffffff24;
  Casemode CVar9;
  QString *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff33;
  uint in_stack_ffffffffffffff34;
  QString *in_stack_ffffffffffffff38;
  QWidgetLineControl *in_stack_ffffffffffffff40;
  int local_a8;
  undefined1 local_9d;
  Casemode local_9c;
  int local_98;
  QChar local_78;
  QChar local_76;
  QChar local_74;
  QChar local_72;
  QChar local_70;
  QChar local_6e;
  QChar local_6c;
  QChar local_6a [6];
  QChar local_5e;
  QChar local_5c;
  QChar local_5a;
  QChar local_58;
  QChar local_56;
  QChar local_54;
  QChar local_52;
  QChar local_50;
  QChar local_4e;
  char16_t local_4c;
  QChar local_4a [16];
  QChar local_2a [16];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::QChar<char16_t,_true>(&local_a,L';');
  qVar4 = QString::indexOf(in_stack_ffffffffffffff18,
                           (QChar)(char16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30),
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
  bVar1 = QString::isEmpty((QString *)0x5dee06);
  if ((bVar1) || (qVar4 == 0)) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                        *)0x5dee23);
    if (bVar1) {
      std::
      unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
      ::reset((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
              (nullptr_t)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      *(undefined4 *)(in_RDI + 0x60) = 0x7fff;
      QString::QString((QString *)0x5dee57);
      internalSetText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                      (bool)in_stack_ffffffffffffff33);
      QString::~QString((QString *)0x5dee7d);
    }
  }
  else {
    if (qVar4 == -1) {
      QChar::QChar<char16_t,_true>(local_2a,L' ');
      *(char16_t *)(in_RDI + 0xe0) = local_2a[0].ucs;
      QString::operator=((QString *)(in_RDI + 200),(QString *)in_RSI);
    }
    else {
      QString::left(in_stack_ffffffffffffff28,
                    CONCAT44(in_stack_ffffffffffffff24,
                             CONCAT13(in_stack_ffffffffffffff23,
                                      CONCAT12(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))
                            ));
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      QString::~QString((QString *)0x5def03);
      in_stack_ffffffffffffff40 = (QWidgetLineControl *)(qVar4 + 1);
      qVar4 = QString::size(in_RSI);
      if ((long)in_stack_ffffffffffffff40 < qVar4) {
        local_4a[0] = QString::operator[](in_stack_ffffffffffffff18,
                                          CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10));
      }
      else {
        QChar::QChar<char16_t,_true>(local_4a,L' ');
      }
      *(char16_t *)(in_RDI + 0xe0) = local_4a[0].ucs;
    }
    *(undefined4 *)(in_RDI + 0x60) = 0;
    bVar1 = false;
    local_98 = 0;
    while( true ) {
      txt = (QString *)(long)local_98;
      qVar4 = QString::size((QString *)(in_RDI + 200));
      if (qVar4 <= (long)txt) break;
      local_4c = 0xaaaa;
      local_4c = (char16_t)
                 QString::at(in_stack_ffffffffffffff18,
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (bVar1) {
        *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
        bVar1 = false;
      }
      else {
        QChar::QChar<char16_t,_true>(&local_4e,L'\\');
        bVar2 = ::operator==((QChar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             (QChar *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        if (bVar2) {
          bVar1 = true;
        }
        else {
          QChar::QChar<char16_t,_true>(&local_50,L'\\');
          bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),
                               (QChar *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
          in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
          if (bVar2) {
            QChar::QChar<char16_t,_true>(&local_52,L'!');
            bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10),
                                 (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08));
            in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
            if (bVar2) {
              QChar::QChar<char16_t,_true>(&local_54,L'<');
              bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                     in_stack_ffffffffffffff10),
                                   (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08));
              in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
              if (bVar2) {
                QChar::QChar<char16_t,_true>(&local_56,L'>');
                bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                       in_stack_ffffffffffffff10),
                                     (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08));
                in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
                if (bVar2) {
                  QChar::QChar<char16_t,_true>(&local_58,L'{');
                  bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10),
                                       (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08));
                  in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
                  if (bVar2) {
                    QChar::QChar<char16_t,_true>(&local_5a,L'}');
                    bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                           in_stack_ffffffffffffff10),
                                         (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                           in_stack_ffffffffffffff08));
                    in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
                    if (bVar2) {
                      QChar::QChar<char16_t,_true>(&local_5c,L'[');
                      bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10),
                                           (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                             in_stack_ffffffffffffff08));
                      in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
                      if (bVar2) {
                        QChar::QChar<char16_t,_true>(&local_5e,L']');
                        bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                               in_stack_ffffffffffffff10),
                                             (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                               in_stack_ffffffffffffff08));
                        in_stack_ffffffffffffff34 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff34);
                      }
                    }
                  }
                }
              }
            }
          }
          if ((char)(in_stack_ffffffffffffff34 >> 0x18) != '\0') {
            *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
          }
        }
      }
      local_98 = local_98 + 1;
    }
    std::make_unique<QWidgetLineControl::MaskInputData[]>((size_t)txt);
    std::
    unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
    ::operator=((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                (unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::
    unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
    ::~unique_ptr((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_9c = NoCaseMode;
    bVar1 = false;
    local_a8 = 0;
    while( true ) {
      lVar5 = (long)local_a8;
      qVar4 = QString::size((QString *)(in_RDI + 200));
      if (qVar4 <= lVar5) break;
      local_6a[0].ucs = L'ꪪ';
      local_6a[0] = QString::at(in_stack_ffffffffffffff18,
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if (bVar1) {
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        (pMVar6->maskChar).ucs = local_6a[0].ucs;
        bVar8 = 1;
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        pMVar6->separator = (bool)(bVar8 & 1);
        CVar9 = local_9c;
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        pMVar6->caseMode = CVar9;
        bVar1 = false;
      }
      else {
        QChar::QChar<char16_t,_true>(&local_6c,L'<');
        bVar2 = ::operator==((QChar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             (QChar *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        if (bVar2) {
          local_9c = Lower;
        }
        else {
          QChar::QChar<char16_t,_true>(&local_6e,L'>');
          bVar2 = ::operator==((QChar *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),
                               (QChar *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
          if (bVar2) {
            local_9c = Upper;
          }
          else {
            QChar::QChar<char16_t,_true>(&local_70,L'!');
            bVar2 = ::operator==((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10),
                                 (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08));
            if (bVar2) {
              local_9c = NoCaseMode;
            }
            else {
              QChar::QChar<char16_t,_true>(&local_72,L'{');
              bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                     in_stack_ffffffffffffff10),
                                   (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08));
              bVar7 = false;
              if (bVar2) {
                QChar::QChar<char16_t,_true>(&local_74,L'}');
                bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                       in_stack_ffffffffffffff10),
                                     (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08));
                bVar7 = false;
                if (bVar2) {
                  QChar::QChar<char16_t,_true>(&local_76,L'[');
                  bVar2 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                         in_stack_ffffffffffffff10),
                                       (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08));
                  bVar7 = false;
                  if (bVar2) {
                    QChar::QChar<char16_t,_true>(&local_78,L']');
                    bVar7 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff14,
                                                           in_stack_ffffffffffffff10),
                                         (QChar *)CONCAT44(in_stack_ffffffffffffff0c,
                                                           in_stack_ffffffffffffff08));
                  }
                }
              }
              if (bVar7 != false) {
                cVar3 = QChar::unicode(local_6a);
                in_stack_ffffffffffffff18 = (QString *)(ulong)((ushort)cVar3 - 0x23);
                switch(in_stack_ffffffffffffff18) {
                case (QString *)0x0:
                case (QString *)0xd:
                case (QString *)0x16:
                case (QString *)0x1e:
                case (QString *)0x1f:
                case (QString *)0x21:
                case (QString *)0x25:
                case (QString *)0x2b:
                case (QString *)0x35:
                case (QString *)0x3e:
                case (QString *)0x3f:
                case (QString *)0x41:
                case (QString *)0x45:
                case (QString *)0x4b:
                case (QString *)0x55:
                  local_9d = 0;
                  break;
                case (QString *)0x39:
                  bVar1 = true;
                default:
                  local_9d = 1;
                }
                if (!bVar1) {
                  pMVar6 = std::
                           unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                           ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                         *)CONCAT44(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10),
                                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
                  (pMVar6->maskChar).ucs = local_6a[0].ucs;
                  in_stack_ffffffffffffff10 = CONCAT13(local_9d,(int3)in_stack_ffffffffffffff10);
                  pMVar6 = std::
                           unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                           ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                         *)CONCAT44(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10),
                                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
                  pMVar6->separator = (bool)((byte)((uint)in_stack_ffffffffffffff10 >> 0x18) & 1);
                  in_stack_ffffffffffffff14 = local_9c;
                  pMVar6 = std::
                           unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                           ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                         *)CONCAT44(local_9c,in_stack_ffffffffffffff10),
                                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
                  pMVar6->caseMode = in_stack_ffffffffffffff14;
                }
              }
            }
          }
        }
      }
      local_a8 = local_a8 + 1;
    }
    internalSetText(in_stack_ffffffffffffff40,txt,in_stack_ffffffffffffff34,
                    (bool)in_stack_ffffffffffffff33);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::parseInputMask(const QString &maskFields)
{
    qsizetype delimiter = maskFields.indexOf(u';');
    if (maskFields.isEmpty() || delimiter == 0) {
        if (m_maskData) {
            m_maskData.reset();
            m_maxLength = 32767;
            internalSetText(QString(), -1, false);
        }
        return;
    }

    if (delimiter == -1) {
        m_blank = u' ';
        m_inputMask = maskFields;
    } else {
        m_inputMask = maskFields.left(delimiter);
        m_blank = (delimiter + 1 < maskFields.size()) ? maskFields[delimiter + 1] : u' ';
    }

    // calculate m_maxLength / m_maskData length
    m_maxLength = 0;
    bool escaped = false;
    for (int i=0; i<m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escaped) {
           ++m_maxLength;
           escaped = false;
           continue;
        }

        if (c == u'\\') {
           escaped = true;
           continue;
        }

        if (c != u'\\' && c != u'!' && c != u'<' && c != u'>' &&
             c != u'{' && c != u'}' && c != u'[' && c != u']')
            m_maxLength++;
    }

    m_maskData = std::make_unique<MaskInputData[]>(m_maxLength);

    MaskInputData::Casemode m = MaskInputData::NoCaseMode;
    bool s;
    bool escape = false;
    int index = 0;
    for (int i = 0; i < m_inputMask.size(); i++) {
        const auto c = m_inputMask.at(i);
        if (escape) {
            s = true;
            m_maskData[index].maskChar = c;
            m_maskData[index].separator = s;
            m_maskData[index].caseMode = m;
            index++;
            escape = false;
        } else if (c == u'<') {
            m = MaskInputData::Lower;
        } else if (c == u'>') {
            m = MaskInputData::Upper;
        } else if (c == u'!') {
            m = MaskInputData::NoCaseMode;
        } else if (c != u'{' && c != u'}' && c != u'[' && c != u']') {
            switch (c.unicode()) {
            case 'A':
            case 'a':
            case 'N':
            case 'n':
            case 'X':
            case 'x':
            case '9':
            case '0':
            case 'D':
            case 'd':
            case '#':
            case 'H':
            case 'h':
            case 'B':
            case 'b':
                s = false;
                break;
            case '\\':
                escape = true;
                Q_FALLTHROUGH();
            default:
                s = true;
                break;
            }

            if (!escape) {
                m_maskData[index].maskChar = c;
                m_maskData[index].separator = s;
                m_maskData[index].caseMode = m;
                index++;
            }
        }
    }
    internalSetText(m_text, -1, false);
}